

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O1

void m68k_op_cas_16_aw(void)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint addr_in;
  uint uVar6;
  
  if (((ushort)m68ki_cpu.cpu_type & 0x3f8) == 0) {
    m68ki_exception_illegal();
    return;
  }
  my_fc_handler(m68ki_cpu.s_flag | 2);
  uVar5 = m68ki_cpu.pc & m68ki_cpu.address_mask;
  m68ki_cpu.pc = m68ki_cpu.pc + 2;
  my_fc_handler(m68ki_cpu.s_flag | 2);
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar5 = pmmu_translate_addr(uVar5);
  }
  uVar2 = m68k_read_memory_16(uVar5 & m68ki_cpu.address_mask);
  my_fc_handler(m68ki_cpu.s_flag | 2);
  uVar5 = m68ki_cpu.pc & m68ki_cpu.address_mask;
  m68ki_cpu.pc = m68ki_cpu.pc + 2;
  my_fc_handler(m68ki_cpu.s_flag | 2);
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar5 = pmmu_translate_addr(uVar5);
  }
  uVar3 = m68k_read_memory_16(uVar5 & m68ki_cpu.address_mask);
  addr_in = (uint)(short)uVar3;
  my_fc_handler(m68ki_address_space | m68ki_cpu.s_flag);
  uVar5 = addr_in;
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar5 = pmmu_translate_addr(addr_in);
  }
  uVar4 = m68k_read_memory_16(uVar5 & m68ki_cpu.address_mask);
  uVar3 = m68ki_cpu.dar[uVar2 & 7];
  uVar6 = uVar4 - (uVar3 & 0xffff);
  m68ki_cpu.n_flag = uVar6 >> 8;
  m68ki_cpu.v_flag = ((uVar6 ^ uVar4) & (uVar3 ^ uVar4)) >> 8;
  m68ki_cpu.not_z_flag = uVar6 & 0xffff;
  m68ki_cpu.c_flag = m68ki_cpu.n_flag;
  if (m68ki_cpu.not_z_flag != 0) {
    m68ki_cpu.dar[uVar2 & 7] = uVar3 & 0xffff0000 | uVar4;
    return;
  }
  m68ki_remaining_cycles = m68ki_remaining_cycles + -3;
  uVar1 = *(ushort *)((long)m68ki_cpu.dar + (ulong)(uVar2 >> 4 & 0x1c));
  my_fc_handler(m68ki_cpu.s_flag | 1);
  if (m68ki_cpu.pmmu_enabled != 0) {
    addr_in = pmmu_translate_addr(addr_in);
  }
  m68k_write_memory_16(addr_in & m68ki_cpu.address_mask,(uint)uVar1);
  return;
}

Assistant:

static void m68k_op_cas_16_aw(void)
{
	if(CPU_TYPE_IS_EC020_PLUS(CPU_TYPE))
	{
		uint word2 = OPER_I_16();
		uint ea = EA_AW_16();
		uint dest = m68ki_read_16(ea);
		uint* compare = &REG_D[word2 & 7];
		uint res = dest - MASK_OUT_ABOVE_16(*compare);

		m68ki_trace_t0();			   /* auto-disable (see m68kcpu.h) */
		FLAG_N = NFLAG_16(res);
		FLAG_Z = MASK_OUT_ABOVE_16(res);
		FLAG_V = VFLAG_SUB_16(*compare, dest, res);
		FLAG_C = CFLAG_16(res);

		if(COND_NE())
			*compare = MASK_OUT_BELOW_16(*compare) | dest;
		else
		{
			USE_CYCLES(3);
			m68ki_write_16(ea, MASK_OUT_ABOVE_16(REG_D[(word2 >> 6) & 7]));
		}
		return;
	}
	m68ki_exception_illegal();
}